

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void imtqlx(int n,double *d,double *e,double *z)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  if (n != 1) {
    lVar1 = (long)n;
    e[lVar1 + -1] = 0.0;
    uVar9 = 0;
    iVar3 = 0;
    if (0 < n) {
      iVar3 = n;
    }
    for (uVar7 = 1; uVar7 != iVar3 + 1; uVar7 = uVar7 + 1) {
      iVar2 = 0;
      uVar9 = uVar7;
LAB_001c8c0d:
      for (; (long)uVar9 < lVar1; uVar9 = uVar9 + 1) {
        if (ABS(e[uVar9 - 1]) <= (ABS(d[uVar9]) + ABS(d[uVar9 - 1])) * 2.220446049250313e-16)
        goto LAB_001c8c48;
      }
      uVar9 = (ulong)(uint)n;
LAB_001c8c48:
      if (uVar7 != (uVar9 & 0xffffffff)) {
        if (iVar2 == 0x1e) {
          std::operator<<((ostream *)&std::cerr,"\n");
          std::operator<<((ostream *)&std::cerr,"IMTQLX - Fatal error!\n");
          std::operator<<((ostream *)&std::cerr,"  Iteration limit exceeded\n");
          exit(1);
        }
        dVar14 = e[uVar7 - 1];
        dVar13 = (d[uVar7] - d[uVar7 - 1]) / (dVar14 + dVar14);
        dVar11 = 0.0;
        lVar10 = (long)(int)uVar9;
        dVar13 = dVar14 / (ABS(SQRT(dVar13 * dVar13 + 1.0)) *
                           *(double *)(&DAT_0021b1c0 + (ulong)(dVar13 < 0.0) * 8) + dVar13) +
                 (d[lVar10 + -1] - d[uVar7 - 1]);
        dVar12 = 1.0;
        dVar14 = 1.0;
        lVar4 = lVar10 * 8;
        for (uVar9 = 1; lVar8 = lVar4 + -8, (long)uVar9 <= (long)(lVar10 - uVar7); uVar9 = uVar9 + 1
            ) {
          dVar16 = *(double *)((long)e + lVar4 + -0x10);
          dVar12 = dVar12 * dVar16;
          if (ABS(dVar13) <= ABS(dVar12)) {
            dVar17 = dVar13 / dVar12;
            dVar15 = SQRT(dVar17 * dVar17 + 1.0);
            dVar13 = dVar12 * dVar15;
            dVar12 = 1.0 / dVar15;
            dVar17 = dVar17 * dVar12;
          }
          else {
            dVar12 = dVar12 / dVar13;
            dVar17 = SQRT(dVar12 * dVar12 + 1.0);
            dVar13 = dVar13 * dVar17;
            dVar17 = 1.0 / dVar17;
            dVar12 = dVar12 * dVar17;
          }
          dVar14 = dVar14 * dVar16;
          *(double *)((long)e + lVar8) = dVar13;
          dVar16 = *(double *)((long)d + lVar8) - dVar11;
          dVar13 = (*(double *)((long)d + lVar4 + -0x10) - dVar16) * dVar12 +
                   (dVar17 + dVar17) * dVar14;
          dVar11 = dVar12 * dVar13;
          *(double *)((long)d + lVar8) = dVar16 + dVar11;
          dVar13 = dVar13 * dVar17 - dVar14;
          dVar14 = *(double *)((long)z + lVar4 + -0x10);
          dVar16 = *(double *)((long)z + lVar8);
          *(double *)((long)z + lVar8) = dVar12 * dVar14 + dVar17 * dVar16;
          *(double *)((long)z + lVar4 + -0x10) = dVar14 * dVar17 - dVar16 * dVar12;
          dVar14 = dVar17;
          lVar4 = lVar8;
        }
        iVar2 = iVar2 + 1;
        d[uVar7 - 1] = d[uVar7 - 1] - dVar11;
        e[uVar7 - 1] = dVar13;
        e[lVar10 + -1] = 0.0;
        uVar9 = uVar7;
        goto LAB_001c8c0d;
      }
    }
    for (uVar7 = 2; (long)uVar7 <= (long)(int)uVar9; uVar7 = uVar7 + 1) {
      uVar5 = uVar7 - 1 & 0xffffffff;
      dVar14 = d[uVar7 - 2];
      for (uVar6 = uVar7; (long)uVar6 <= lVar1; uVar6 = uVar6 + 1) {
        if (d[uVar6 - 1] < dVar14) {
          uVar5 = uVar6 & 0xffffffff;
          dVar14 = d[uVar6 - 1];
        }
      }
      if (uVar7 - 1 != uVar5) {
        lVar4 = (long)(int)uVar5;
        d[lVar4 + -1] = d[uVar7 - 2];
        d[uVar7 - 2] = dVar14;
        dVar14 = z[uVar7 - 2];
        z[uVar7 - 2] = z[lVar4 + -1];
        z[lVar4 + -1] = dVar14;
      }
    }
  }
  return;
}

Assistant:

void imtqlx ( int n, double d[], double e[], double z[] )

//****************************************************************************80
//
//  Purpose:
//
//    IMTQLX diagonalizes a symmetric tridiagonal matrix.
//
//  Discussion:
//
//    This routine is a slightly modified version of the EISPACK routine to 
//    perform the implicit QL algorithm on a symmetric tridiagonal matrix. 
//
//    The authors thank the authors of EISPACK for permission to use this
//    routine. 
//
//    It has been modified to produce the product Q' * Z, where Z is an input 
//    vector and Q is the orthogonal matrix diagonalizing the input matrix.  
//    The changes consist (essentially) of applying the orthogonal transformations
//    directly to Z as they are generated.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    08 January 2010
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//    Roger Martin, James Wilkinson,
//    The Implicit QL Algorithm,
//    Numerische Mathematik,
//    Volume 12, Number 5, December 1968, pages 377-383.
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Input/output, double D(N), the diagonal entries of the matrix.
//    On output, the information in D has been overwritten.
//
//    Input/output, double E(N), the subdiagonal entries of the 
//    matrix, in entries E(1) through E(N-1).  On output, the information in
//    E has been overwritten.
//
//    Input/output, double Z(N).  On input, a vector.  On output,
//    the value of Q' * Z, where Q is the matrix that diagonalizes the
//    input symmetric tridiagonal matrix.
//
{
  double b;
  double c;
  double f;
  double g;
  int i;
  int ii;
  int itn = 30;
  int j;
  int k;
  int l;
  int m = 0; // Silence uninitialized warning.
  int mml;
  double p;
  double prec;
  double r;
  double s;

  prec = r8_epsilon ( );

  if ( n == 1 )
  {
    return;
  }

  e[n-1] = 0.0;

  for ( l = 1; l <= n; l++ )
  {
    j = 0;
    for ( ; ; )
    {
      for ( m = l; m <= n; m++ )
      {
        if ( m == n )
        {
          break;
        }

        if ( fabs ( e[m-1] ) <= prec * ( fabs ( d[m-1] ) + fabs ( d[m] ) ) )
        {
          break;
        }
      }
      p = d[l-1];
      if ( m == l )
      {
        break;
      }
      if ( itn <= j )
      {
        std::cerr << "\n";
        std::cerr << "IMTQLX - Fatal error!\n";
        std::cerr << "  Iteration limit exceeded\n";
        exit ( 1 );
      }
      j = j + 1;
      g = ( d[l] - p ) / ( 2.0 * e[l-1] );
      r = sqrt ( g * g + 1.0 );
      g = d[m-1] - p + e[l-1] / ( g + fabs ( r ) * r8_sign ( g ) );
      s = 1.0;
      c = 1.0;
      p = 0.0;
      mml = m - l;

      for ( ii = 1; ii <= mml; ii++ )
      {
        i = m - ii;
        f = s * e[i-1];
        b = c * e[i-1];

        if ( fabs ( g ) <= fabs ( f ) )
        {
          c = g / f;
          r = sqrt ( c * c + 1.0 );
          e[i] = f * r;
          s = 1.0 / r;
          c = c * s;
        }
        else
        {
          s = f / g;
          r = sqrt ( s * s + 1.0 );
          e[i] = g * r;
          c = 1.0 / r;
          s = s * c;
        }
        g = d[i] - p;
        r = ( d[i-1] - g ) * s + 2.0 * c * b;
        p = s * r;
        d[i] = g + p;
        g = c * r - b;
        f = z[i];
        z[i] = s * z[i-1] + c * f;
        z[i-1] = c * z[i-1] - s * f;
      }
      d[l-1] = d[l-1] - p;
      e[l-1] = g;
      e[m-1] = 0.0;
    }
  }
//
//  Sorting.
//
  for ( ii = 2; ii <= m; ii++ )
  {
    i = ii - 1;
    k = i;
    p = d[i-1];

    for ( j = ii; j <= n; j++ )
    {
      if ( d[j-1] < p )
      {
         k = j;
         p = d[j-1];
      }
    }

    if ( k != i )
    {
      d[k-1] = d[i-1];
      d[i-1] = p;
      p = z[i-1];
      z[i-1] = z[k-1];
      z[k-1] = p;
    }
  }
  return;
}